

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void PatternMatch_CStyleParam(KonohaContext *kctx,KonohaStack *sfp)

{
  int iVar1;
  kNode *node;
  uintptr_t uVar2;
  kFunc *pkVar3;
  uintptr_t uVar4;
  long lVar5;
  kObjectVar *tokenList;
  kmagicflag_t kVar6;
  uint uVar7;
  kNameSpace *ns;
  kNode *o;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  kint_t kVar13;
  KTokenSeq param;
  
  node = sfp[1].field_0.asNode;
  uVar2 = sfp[2].field_1.unboxValue;
  pkVar3 = sfp[3].field_0.asFunc;
  uVar4 = sfp[4].field_1.unboxValue;
  iVar8 = 0;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_CStyleParam",0x477,"tracing..");
  lVar12 = uVar4 << 0x20;
  lVar5 = *(long *)((long)&(pkVar3->env->h).magicflag + (lVar12 >> 0x1d));
  if (*(int *)(*(long *)(lVar5 + 0x38) + 0x20) == 7) {
    ns = kNode_GetNameSpace(kctx,node);
    tokenList = *(kObjectVar **)(lVar5 + 0x20);
    param.beginIdx = 1;
    uVar7 = (uint)((tokenList->field_1).fieldUnboxItems[0] >> 3);
    uVar10 = uVar7 - 1;
    param.field_4.SourceConfig.openToken = (kToken *)0x0;
    param.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
    param.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
    uVar9 = 0;
    if (0 < (int)uVar10) {
      uVar9 = (ulong)uVar10;
    }
    for (uVar11 = 0; param.ns = ns, param.tokenList = (kArray *)tokenList, uVar9 != uVar11;
        uVar11 = uVar11 + 1) {
      kVar6 = (&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[uVar11];
      iVar1 = *(int *)(kVar6 + 0x30);
      if (iVar1 == 0x20) {
        *(undefined8 *)(kVar6 + 0x38) =
             *(undefined8 *)(*(long *)((*kctx->runtimeModels)[1].setupModelContext + 0xc0) + 0x38);
        iVar8 = iVar8 + 1;
      }
      else if (iVar1 == 0x29) {
        param.endIdx = (uint)uVar11;
        goto LAB_00115a27;
      }
    }
    param.endIdx = uVar10;
    if (1 < (int)uVar10 && iVar8 == 0) {
      (*(kctx->platApi->GCModule).UpdateObjectField)
                (tokenList,
                 (kObjectVar *)(&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[uVar10],
                 *(kObjectVar **)((*kctx->runtimeModels)[1].setupModelContext + 0xc0));
      (&((tokenList->field_1).fieldObjectItems[1]->h).magicflag)[uVar10] =
           *(kmagicflag_t *)((*kctx->runtimeModels)[1].setupModelContext + 0xc0);
      param.endIdx = uVar7;
    }
LAB_00115a27:
    o = ParseNewNode(kctx,ns,(kArray *)tokenList,&param.beginIdx,param.endIdx,ParseMetaPatternOption
                     ,(char *)0x0);
    kNode_AddParsedObject(kctx,node,(ksymbol_t)uVar2,(kObject_conflict *)o);
    kVar13 = lVar12 + 0x100000000 >> 0x20;
  }
  else {
    kVar13 = -1;
  }
  sfp[-4].field_1.intValue = kVar13;
  return;
}

Assistant:

static KMETHOD PatternMatch_CStyleParam(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	int returnIdx = -1;
	kToken *tk = tokenList->TokenItems[beginIdx];
	if(tk->resolvedSyntaxInfo->keyword == KSymbol_ParenthesisGroup) {
		KTokenSeq param = {kNode_ns(stmt), RangeGroup(tk->GroupTokenList)};
		CheckCStyleParam(kctx, &param);
		kNode *block = ParseNewNode(kctx, param.ns, param.tokenList, &param.beginIdx, param.endIdx, ParseMetaPatternOption, NULL);
		kNode_AddParsedObject(kctx, stmt, name, UPCAST(block));
		returnIdx = beginIdx + 1;
	}
	KReturnUnboxValue(returnIdx);
}